

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.h
# Opt level: O2

uint32_t sx_hash_fnv32_str(char *str)

{
  char cVar1;
  uint32_t hval;
  
  hval = 0x811c9dc5;
  while( true ) {
    cVar1 = *str;
    if (cVar1 == '\0') break;
    str = str + 1;
    hval = (hval ^ (int)cVar1) * 0x1000193;
  }
  return hval;
}

Assistant:

SX_INLINE SX_CONSTEXPR uint32_t sx_hash_fnv32_str(const char* str)
{
    const char* s = str;

    uint32_t hval = FNV1_32_INIT;
    while (*s) {
        hval ^= (uint32_t)*s++;
        hval *= FNV1_32_PRIME;
    }

    return hval;
}